

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satelite.cpp
# Opt level: O1

bool __thiscall Clasp::SatElite::bceVe(SatElite *this,Var v,uint32 maxCnt)

{
  OccurList *pOVar1;
  undefined1 *puVar2;
  uint uVar3;
  uint uVar4;
  Clause *c2;
  pointer ppCVar5;
  Literal *pLVar6;
  ClauseList *this_00;
  bool bVar7;
  ulong uVar8;
  uint uVar9;
  uint *puVar10;
  uint uVar11;
  ulong uVar12;
  uint *puVar13;
  uint uVar14;
  ulong uVar15;
  Literal *pLVar16;
  size_type sVar17;
  bool freeId;
  ClRange CVar18;
  Clause *lhs;
  Clause *rhs;
  uint local_80;
  Clause *local_78;
  uint32 local_70;
  uint local_6c;
  Literal *local_68;
  uint *local_60;
  Clause *local_58;
  ulong local_50;
  Literal *local_48;
  ulong local_40;
  ClauseList *local_38;
  
  local_50 = (ulong)v;
  bVar7 = true;
  if ((((*(((this->super_SatPreprocessor).ctx_)->solvers_).ebo_.buf)->assign_).assign_.ebo_.buf
       [local_50] & 3) == 0) {
    uVar14 = 0;
    (this->resCands_).ebo_.size = 0;
    uVar9 = *(uint *)(this->super_SatPreprocessor).opts_ & 3;
    local_70 = maxCnt;
    CVar18 = splitOcc(this,v,uVar9 == 3);
    sVar17 = 0;
    if (uVar9 == 3) {
      sVar17 = this->occT_[1].ebo_.size;
    }
    if (this->occT_[0].ebo_.size == 0) {
      local_80 = 0;
    }
    else {
      local_38 = &this->resCands_;
      puVar13 = this->occT_[0].ebo_.buf;
      local_6c = (uint)(uVar9 >= 2) << 0x1f;
      uVar15 = 0;
      local_80 = 0;
      do {
        local_78 = (this->super_SatPreprocessor).clauses_.ebo_.buf[*puVar13];
        uVar3 = *(uint *)&local_78->field_0x8;
        if ((uVar3 & 0x3fffffff) != 0) {
          uVar8 = 0;
          do {
            uVar4 = local_78->lits_[uVar8].rep_;
            uVar11 = uVar4 >> 2;
            uVar12 = 0x4000000000000000;
            if ((uVar4 & 2) != 0) {
              uVar12 = 0x8000000000000000;
            }
            *(ulong *)&this->occurs_[uVar11].field_0x18 =
                 *(ulong *)&this->occurs_[uVar11].field_0x18 & 0x3fffffffffffffff | uVar12;
            uVar8 = uVar8 + 1;
          } while (((ulong)uVar3 & 0x3fffffff) != uVar8);
        }
        *(uint *)&local_78->field_0x8 = *(uint *)&local_78->field_0x8 & 0x7fffffff | local_6c;
        if (this->occT_[1].ebo_.size != 0) {
          puVar10 = this->occT_[1].ebo_.buf;
          local_60 = puVar13;
          local_40 = uVar15;
          do {
            local_68 = CVar18.second;
            local_48 = CVar18.first;
            c2 = (this->super_SatPreprocessor).clauses_.ebo_.buf[*puVar10];
            local_58 = c2;
            bVar7 = trivialResolvent(this,c2,v);
            this_00 = local_38;
            if (!bVar7) {
              uVar3 = *(uint *)&c2->field_0x8;
              *(uint *)&c2->field_0x8 = uVar3 & 0x7fffffff;
              *(uint *)&local_78->field_0x8 = *(uint *)&local_78->field_0x8 & 0x7fffffff;
              sVar17 = sVar17 + ((int)uVar3 >> 0x1f);
              uVar14 = uVar14 + 1;
              if (local_70 < uVar14) {
                if (sVar17 == 0) {
                  sVar17 = 0;
                  uVar15 = CONCAT71((int7)((ulong)local_78 >> 8),uVar9 < 2) & 0xffffffff;
                  break;
                }
              }
              else {
                bk_lib::
                pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
                ::push_back(local_38,&local_78);
                bk_lib::
                pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
                ::push_back(this_00,&local_58);
              }
            }
            CVar18.second = local_68;
            CVar18.first = local_48;
            puVar10 = puVar10 + 1;
            uVar15 = local_40;
          } while (puVar10 != this->occT_[1].ebo_.buf + this->occT_[1].ebo_.size);
          CVar18.second = local_68;
          CVar18.first = local_48;
          puVar13 = local_60;
        }
        uVar3 = *(uint *)&local_78->field_0x8;
        if ((uVar3 & 0x3fffffff) != 0) {
          uVar8 = 0;
          do {
            puVar2 = &this->occurs_[local_78->lits_[uVar8].rep_ >> 2].field_0x18;
            *(ulong *)puVar2 = *(ulong *)puVar2 & 0x3fffffffffffffff;
            uVar8 = uVar8 + 1;
          } while (((ulong)uVar3 & 0x3fffffff) != uVar8);
        }
        if (*(int *)&local_78->field_0x8 < 0) {
          uVar8 = (ulong)local_80;
          local_80 = local_80 + 1;
          this->occT_[0].ebo_.buf[uVar8] = *puVar13;
        }
        puVar13 = puVar13 + 1;
      } while ((puVar13 != this->occT_[0].ebo_.buf + this->occT_[0].ebo_.size) &&
              ((uVar15 & 1) == 0));
    }
    local_68 = CVar18.second;
    local_48 = CVar18.first;
    if (local_70 < uVar14) {
      if (local_80 + sVar17 != 0) {
        if (local_80 != 0) {
          uVar15 = 0;
          do {
            local_68 = CVar18.second;
            local_48 = CVar18.first;
            bceVeRemove(this,this->occT_[0].ebo_.buf[uVar15],false,v,true);
            CVar18.second = local_68;
            CVar18.first = local_48;
            uVar15 = uVar15 + 1;
          } while (local_80 != uVar15);
        }
        if (sVar17 != 0) {
          puVar13 = this->occT_[1].ebo_.buf;
          do {
            local_68 = CVar18.second;
            local_48 = CVar18.first;
            local_58 = (this->super_SatPreprocessor).clauses_.ebo_.buf[*puVar13];
            if (*(int *)&local_58->field_0x8 < 0) {
              bceVeRemove(this,*puVar13,false,v,true);
              CVar18.second = local_68;
              CVar18.first = local_48;
              sVar17 = sVar17 - 1;
            }
            puVar13 = puVar13 + 1;
          } while (sVar17 != 0);
        }
      }
    }
    else {
      SharedContext::eliminate((this->super_SatPreprocessor).ctx_,v);
      pLVar6 = local_48;
      pLVar16 = local_48;
      if (local_48 != local_68) {
        do {
          uVar9 = pLVar16->rep_ >> 2;
          if ((this->super_SatPreprocessor).clauses_.ebo_.buf[uVar9] != (Clause *)0x0) {
            freeId = uVar14 != 0;
            bVar7 = uVar14 == 0;
            uVar14 = uVar14 - 1;
            if (bVar7) {
              uVar14 = 0;
            }
            bceVeRemove(this,uVar9,freeId,v,false);
          }
          pLVar16 = pLVar16 + 1;
        } while (pLVar16 != local_68);
      }
      if ((this->resCands_).ebo_.size != 0) {
        uVar15 = 0;
        do {
          ppCVar5 = (this->resCands_).ebo_.buf;
          bVar7 = addResolvent(this,*(uint *)((long)&pLVar6->rep_ + uVar15 * 2) >> 2,
                               ppCVar5[uVar15 & 0xffffffff],ppCVar5[(int)uVar15 + 1]);
          if (!bVar7) {
            return false;
          }
          uVar15 = uVar15 + 2;
        } while ((size_type)uVar15 != (this->resCands_).ebo_.size);
      }
      pOVar1 = this->occurs_ + local_50;
      if (*(int *)&this->occurs_[local_50].refs.super_type.
                   super_left_right_rep<Clasp::Literal,_unsigned_int>.field_0x8 < 0) {
        operator_delete((pOVar1->refs).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>
                        .buf_);
      }
      CVar18.second = local_68;
      CVar18.first = local_48;
      (pOVar1->refs).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.buf_ =
           (buf_type *)0x0;
      *(undefined8 *)
       &(pOVar1->refs).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.field_0x8 = 0;
      (pOVar1->refs).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.right_ = 0;
      *(undefined8 *)&pOVar1->field_0x18 = 0;
    }
    local_68 = CVar18.second;
    local_48 = CVar18.first;
    bVar7 = true;
    if (((ulong)*(this->super_SatPreprocessor).opts_ & 0x1ffc) == 0) {
      bVar7 = backwardSubsume(this);
    }
  }
  return bVar7;
}

Assistant:

bool SatElite::bceVe(Var v, uint32 maxCnt) {
	Solver* s = ctx_->master();
	if (s->value(v) != value_free) return true;
	assert(!ctx_->varInfo(v).frozen() && !ctx_->eliminated(v));
	resCands_.clear();
	// distribute clauses on v
	// check if number of clauses decreases if we'd eliminate v
	uint32 bce     = opts_->bce();
	ClRange cls    = splitOcc(v, bce > 1);
	uint32 cnt     = 0;
	uint32 markMax = ((uint32)occT_[neg].size() * (bce>1));
	uint32 blocked = 0;
	bool stop      = false;
	Clause* lhs, *rhs;
	for (VarVec::const_iterator i = occT_[pos].begin(); i != occT_[pos].end() && !stop; ++i) {
		lhs         = clause(*i);
		markAll(&(*lhs)[0], lhs->size());
		lhs->setMarked(bce != 0);
		for (VarVec::const_iterator j = occT_[neg].begin(); j != occT_[neg].end(); ++j) {
			if (!trivialResolvent(*(rhs = clause(*j)), v)) {
				markMax -= rhs->marked();
				rhs->setMarked(false); // not blocked on v
				lhs->setMarked(false); // not blocked on v
				if (++cnt <= maxCnt) {
					resCands_.push_back(lhs);
					resCands_.push_back(rhs);
				}
				else if (!markMax) {
					stop = (bce == 0);
					break;
				}
			}
		}
		unmarkAll(&(*lhs)[0], lhs->size());
		if (lhs->marked()) {
			occT_[pos][blocked++] = *i;
		}
	}
	if (cnt <= maxCnt) {
		// eliminate v by clause distribution
		ctx_->eliminate(v);  // mark var as eliminated
		// remove old clauses, store them in the elimination table so that
		// (partial) models can be extended.
		for (ClIter it = cls.first; it != cls.second; ++it) {
			// reuse first cnt ids for resolvents
			if (clause(it->var())) {
				bool freeId = (cnt && cnt--);
				bceVeRemove(it->var(), freeId, v, false);
			}
		}
		// add non trivial resolvents
		assert( resCands_.size() % 2 == 0 );
		ClIter it = cls.first;
		for (VarVec::size_type i = 0; i != resCands_.size(); i+=2, ++it) {
			if (!addResolvent(it->var(), *resCands_[i], *resCands_[i+1])) {
				return false;
			}
		}
		assert(occurs_[v].numOcc() == 0);
		// release memory
		occurs_[v].clear();
	}
	else if ( (blocked + markMax) > 0 ) {
		// remove blocked clauses
		for (uint32 i = 0; i != blocked; ++i) {
			bceVeRemove(occT_[pos][i], false, v, true);
		}
		for (VarVec::const_iterator it = occT_[neg].begin(); markMax; ++it) {
			if ( (rhs = clause(*it))->marked() ) {
				bceVeRemove(*it, false, v, true);
				--markMax;
			}
		}
	}
	return opts_->limIters != 0 || backwardSubsume();
}